

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_extract_file_to_mem_no_alloc
                  (mz_zip_archive *pZip,char *pFilename,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  mz_uint file_index_00;
  int file_index;
  void *pUser_read_buf_local;
  mz_uint flags_local;
  size_t buf_size_local;
  void *pBuf_local;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  
  file_index_00 = mz_zip_reader_locate_file(pZip,pFilename,(char *)0x0,flags);
  if ((int)file_index_00 < 0) {
    pZip_local._4_4_ = 0;
  }
  else {
    pZip_local._4_4_ =
         mz_zip_reader_extract_to_mem_no_alloc
                   (pZip,file_index_00,pBuf,buf_size,flags,pUser_read_buf,user_read_buf_size);
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_reader_extract_file_to_mem_no_alloc(
    mz_zip_archive *pZip, const char *pFilename, void *pBuf, size_t buf_size,
    mz_uint flags, void *pUser_read_buf, size_t user_read_buf_size) {
  int file_index = mz_zip_reader_locate_file(pZip, pFilename, NULL, flags);
  if (file_index < 0)
    return MZ_FALSE;
  return mz_zip_reader_extract_to_mem_no_alloc(pZip, file_index, pBuf, buf_size,
                                               flags, pUser_read_buf,
                                               user_read_buf_size);
}